

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::Compiler::type_struct_member_array_stride(Compiler *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  TypedID<(spirv_cross::Types)1> *other;
  CompilerError *pCVar2;
  allocator local_91;
  string local_90 [35];
  undefined1 local_6d;
  allocator local_59;
  string local_58 [32];
  Meta *local_38;
  Decoration *dec;
  Meta *local_28;
  Meta *type_meta;
  SPIRType *pSStack_18;
  uint32_t index_local;
  SPIRType *type_local;
  Compiler *this_local;
  
  type_meta._4_4_ = index;
  pSStack_18 = type;
  type_local = (SPIRType *)this;
  other = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                    (&(type->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,(ulong)index);
  TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
            ((TypedID<(spirv_cross::Types)0> *)((long)&dec + 4),other);
  local_38 = ParsedIR::find_meta(&this->ir,dec._4_4_);
  local_28 = local_38;
  if (local_38 == (Meta *)0x0) {
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_90,"Struct member does not have ArrayStride set.",&local_91);
    CompilerError::CompilerError(pCVar2,(string *)local_90);
    __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  bVar1 = Bitset::get(&(local_38->decoration).decoration_flags,6);
  if (!bVar1) {
    local_6d = 1;
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_58,"Struct member does not have ArrayStride set.",&local_59);
    CompilerError::CompilerError(pCVar2,(string *)local_58);
    local_6d = 0;
    __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  return (local_38->decoration).array_stride;
}

Assistant:

uint32_t Compiler::type_struct_member_array_stride(const SPIRType &type, uint32_t index) const
{
	auto *type_meta = ir.find_meta(type.member_types[index]);
	if (type_meta)
	{
		// Decoration must be set in valid SPIR-V, otherwise throw.
		// ArrayStride is part of the array type not OpMemberDecorate.
		auto &dec = type_meta->decoration;
		if (dec.decoration_flags.get(DecorationArrayStride))
			return dec.array_stride;
		else
			SPIRV_CROSS_THROW("Struct member does not have ArrayStride set.");
	}
	else
		SPIRV_CROSS_THROW("Struct member does not have ArrayStride set.");
}